

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast_obj.h
# Opt level: O2

char * read_map(fastObjData *data,char *ptr,fastObjTexture *map)

{
  byte *s;
  char *pcVar1;
  char *s_00;
  byte bVar2;
  byte *e;
  
  s = (byte *)skip_whitespace(ptr);
  bVar2 = *s;
  e = s;
  if (bVar2 != 0x2d) {
    while ((0xd < bVar2 || ((0x2600U >> (bVar2 & 0x1f) & 1) == 0))) {
      bVar2 = e[1];
      e = e + 1;
    }
    pcVar1 = string_copy((char *)s,(char *)e);
    s_00 = string_concat(data->base,(char *)s,(char *)e);
    string_fix_separators(s_00);
    map->name = pcVar1;
    map->path = s_00;
    s = e;
  }
  return (char *)s;
}

Assistant:

static
const char* read_map(fastObjData* data, const char* ptr, fastObjTexture* map)
{
   const char* s;
   const char* e;
   char*       name;
   char*       path;

   ptr = skip_whitespace(ptr);

   /* Don't support options at present */
   if (*ptr == '-')
       return ptr;


   /* Read name */
   s = ptr;
   while (!is_end_of_name(*ptr))
       ptr++;

   e = ptr;

   name = string_copy(s, e);

   path = string_concat(data->base, s, e);
   string_fix_separators(path);

   map->name = name;
   map->path = path;

   return e;
}